

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextEditState::OnKeyPressed(ImGuiTextEditState *this,int key)

{
  STB_TexteditState *state;
  float *pfVar1;
  int *piVar2;
  ImWchar *pIVar3;
  float fVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  unsigned_short *puVar10;
  StbUndoRecord *pSVar11;
  bool bVar12;
  short sVar13;
  int temp;
  int iVar14;
  int iVar15;
  int iVar16;
  ImGuiStb *pIVar17;
  long lVar18;
  int temp_1;
  long lVar19;
  short *psVar20;
  ulong uVar21;
  undefined8 in_R8;
  int iVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  StbFindState find;
  uchar local_74;
  ImWchar *local_50;
  ImWchar local_48 [6];
  int local_3c;
  int local_38;
  int local_34;
  
  state = &this->StbState;
  pfVar1 = &(this->StbState).preferred_x;
  do {
    iVar16 = (int)in_R8;
    switch(key) {
    case 0x10000:
      iVar16 = (this->StbState).select_start;
      iVar22 = (this->StbState).select_end;
      if (iVar16 == iVar22) {
        if (0 < state->cursor) {
          state->cursor = state->cursor + -1;
        }
      }
      else {
        if (iVar22 < iVar16) {
          (this->StbState).select_end = iVar16;
          (this->StbState).select_start = iVar22;
        }
        iVar16 = (this->StbState).select_start;
        (this->StbState).cursor = iVar16;
        (this->StbState).select_end = iVar16;
        (this->StbState).has_preferred_x = '\0';
      }
      goto LAB_00136ada;
    case 0x10001:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        state->cursor = state->cursor + 1;
      }
      else {
        ImGuiStb::stb_textedit_move_to_last(this,state);
      }
      ImGuiStb::stb_textedit_clamp(this,state);
      goto LAB_00136ada;
    case 0x10002:
switchD_0013629c_caseD_10002:
      local_74 = (this->StbState).single_line;
      if (local_74 == '\0') {
        iVar16 = (this->StbState).select_start;
        iVar22 = (this->StbState).select_end;
        if ((key & 0x20000U) == 0) {
          if (iVar16 != iVar22) {
            if (iVar22 < iVar16) {
              (this->StbState).select_end = iVar16;
              (this->StbState).select_start = iVar22;
            }
            iVar16 = (this->StbState).select_start;
            (this->StbState).cursor = iVar16;
            (this->StbState).select_end = iVar16;
            (this->StbState).has_preferred_x = '\0';
          }
        }
        else if (iVar16 == iVar22) {
          iVar16 = (this->StbState).cursor;
          (this->StbState).select_end = iVar16;
          (this->StbState).select_start = iVar16;
        }
        else {
          state->cursor = iVar22;
        }
        ImGuiStb::stb_textedit_clamp(this,state);
        ImGuiStb::stb_textedit_find_charpos
                  ((ImGuiStb *)local_48,(StbFindState *)this,
                   (ImGuiTextEditState *)(ulong)(uint)(this->StbState).cursor,
                   (uint)(this->StbState).single_line,(int)in_R8);
        iVar16 = local_34;
        if (local_34 != local_3c) {
          pIVar17 = (ImGuiStb *)pfVar1;
          if ((this->StbState).has_preferred_x == '\0') {
            pIVar17 = (ImGuiStb *)local_48;
          }
          fVar4 = *(float *)pIVar17;
          (this->StbState).cursor = local_34;
          puVar10 = (this->Text).Data;
          local_50 = (ImWchar *)0x0;
          pIVar3 = puVar10 + local_34;
          InputTextCalcTextSizeW
                    (pIVar3,puVar10 + this->CurLenW,&local_50,(ImVec2 *)0x1,SUB81(in_R8,0));
          iVar22 = (int)((ulong)((long)local_50 - (long)pIVar3) >> 1);
          if (0 < iVar22) {
            fVar25 = 0.0;
            iVar15 = 1;
            do {
              fVar24 = ImGuiStb::STB_TEXTEDIT_GETWIDTH(this,iVar16,iVar15 + -1);
              if (((fVar24 == -1.0) && (!NAN(fVar24))) || (fVar25 = fVar25 + fVar24, fVar4 < fVar25)
                 ) {
                bVar12 = false;
              }
              else {
                state->cursor = state->cursor + 1;
                bVar12 = true;
              }
            } while ((bVar12) && (bVar12 = iVar15 < iVar22, iVar15 = iVar15 + 1, bVar12));
          }
LAB_0013654b:
          ImGuiStb::stb_textedit_clamp(this,state);
          (this->StbState).has_preferred_x = '\x01';
          (this->StbState).preferred_x = fVar4;
          if ((key & 0x20000U) != 0) {
            (this->StbState).select_end = (this->StbState).cursor;
          }
        }
LAB_0013658a:
        local_74 = '\0';
      }
      else {
        key = key & 0x20000U | 0x10000;
      }
      break;
    case 0x10003:
switchD_0013629c_caseD_10003:
      local_74 = (this->StbState).single_line;
      if (local_74 == '\0') {
        iVar16 = (this->StbState).select_start;
        iVar22 = (this->StbState).select_end;
        if ((key & 0x20000U) == 0) {
          if (iVar16 != iVar22) {
            ImGuiStb::stb_textedit_move_to_last(this,state);
          }
        }
        else if (iVar16 == iVar22) {
          iVar16 = (this->StbState).cursor;
          (this->StbState).select_end = iVar16;
          (this->StbState).select_start = iVar16;
        }
        else {
          state->cursor = iVar22;
        }
        ImGuiStb::stb_textedit_clamp(this,state);
        ImGuiStb::stb_textedit_find_charpos
                  ((ImGuiStb *)local_48,(StbFindState *)this,
                   (ImGuiTextEditState *)(ulong)(uint)(this->StbState).cursor,
                   (uint)(this->StbState).single_line,(int)in_R8);
        if ((long)local_38 != 0) {
          pIVar17 = (ImGuiStb *)pfVar1;
          if ((this->StbState).has_preferred_x == '\0') {
            pIVar17 = (ImGuiStb *)local_48;
          }
          fVar4 = *(float *)pIVar17;
          lVar19 = (long)local_3c + (long)local_38;
          iVar16 = (int)lVar19;
          (this->StbState).cursor = iVar16;
          puVar10 = (this->Text).Data;
          local_50 = (ImWchar *)0x0;
          pIVar3 = puVar10 + lVar19;
          InputTextCalcTextSizeW
                    (pIVar3,puVar10 + this->CurLenW,&local_50,(ImVec2 *)0x1,SUB81(in_R8,0));
          iVar22 = (int)((ulong)((long)local_50 - (long)pIVar3) >> 1);
          if (0 < iVar22) {
            fVar25 = 0.0;
            iVar15 = 1;
            do {
              fVar24 = ImGuiStb::STB_TEXTEDIT_GETWIDTH(this,iVar16,iVar15 + -1);
              if (((fVar24 == -1.0) && (!NAN(fVar24))) || (fVar25 = fVar25 + fVar24, fVar4 < fVar25)
                 ) {
                bVar12 = false;
              }
              else {
                state->cursor = state->cursor + 1;
                bVar12 = true;
              }
            } while ((bVar12) && (bVar12 = iVar15 < iVar22, iVar15 = iVar15 + 1, bVar12));
          }
          goto LAB_0013654b;
        }
        goto LAB_0013658a;
      }
      key = key & 0x20000U | 0x10001;
      break;
    case 0x10004:
      ImGuiStb::stb_textedit_clamp(this,state);
      iVar22 = (this->StbState).select_start;
      iVar15 = (this->StbState).select_end;
      if (iVar22 != iVar15) {
        if (iVar15 < iVar22) {
          (this->StbState).select_end = iVar22;
          (this->StbState).select_start = iVar15;
        }
        iVar22 = (this->StbState).select_start;
        (this->StbState).cursor = iVar22;
        (this->StbState).select_end = iVar22;
        (this->StbState).has_preferred_x = '\0';
      }
      ImGuiStb::stb_textedit_find_charpos
                ((ImGuiStb *)local_48,(StbFindState *)this,
                 (ImGuiTextEditState *)(ulong)(uint)(this->StbState).cursor,
                 (uint)(this->StbState).single_line,iVar16);
      goto LAB_00136ad7;
    case 0x10005:
      ImGuiStb::stb_textedit_clamp(this,state);
      iVar22 = (this->StbState).select_start;
      iVar15 = (this->StbState).select_end;
      if (iVar22 != iVar15) {
        if (iVar15 < iVar22) {
          (this->StbState).select_end = iVar22;
          (this->StbState).select_start = iVar15;
        }
        iVar22 = (this->StbState).select_start;
        (this->StbState).cursor = iVar22;
        (this->StbState).select_end = iVar22;
        (this->StbState).has_preferred_x = '\0';
      }
      ImGuiStb::stb_textedit_find_charpos
                ((ImGuiStb *)local_48,(StbFindState *)this,
                 (ImGuiTextEditState *)(ulong)(uint)(this->StbState).cursor,
                 (uint)(this->StbState).single_line,iVar16);
      (this->StbState).has_preferred_x = '\0';
      lVar19 = (long)local_3c + (long)local_38;
      iVar16 = (int)lVar19;
      (this->StbState).cursor = iVar16;
      if (0 < (long)local_38) {
        if ((this->Text).Size < iVar16) goto LAB_00136eae;
        if ((this->Text).Data[lVar19 + -1] == 10) {
          state->cursor = iVar16 + -1;
        }
      }
      goto LAB_00136ade;
    case 0x10006:
      (this->StbState).select_end = 0;
      (this->StbState).cursor = 0;
      (this->StbState).select_start = 0;
      goto LAB_00136ada;
    case 0x10007:
      (this->StbState).cursor = this->CurLenW;
      (this->StbState).select_start = 0;
      (this->StbState).select_end = 0;
      goto LAB_00136ada;
    case 0x10008:
switchD_0013629c_caseD_10008:
      if ((this->StbState).select_start != (this->StbState).select_end) goto LAB_00136603;
      iVar16 = (this->StbState).cursor;
      if (iVar16 < this->CurLenW) {
        ImGuiStb::stb_textedit_delete(this,state,iVar16,1);
      }
      goto LAB_00136ada;
    case 0x10009:
switchD_0013629c_caseD_10009:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        ImGuiStb::stb_textedit_clamp(this,state);
        iVar16 = (this->StbState).cursor;
        if (0 < iVar16) {
          ImGuiStb::stb_textedit_delete(this,state,iVar16 + -1,1);
          (this->StbState).cursor = (this->StbState).cursor + -1;
        }
      }
      else {
LAB_00136603:
        ImGuiStb::stb_textedit_delete_selection(this,state);
      }
      goto LAB_00136ada;
    case 0x1000a:
      lVar19 = (long)(this->StbState).undostate.undo_point;
      if (lVar19 == 0) goto LAB_00136ada;
      iVar16 = (this->StbState).undostate.undo_rec[lVar19 + -1].where;
      sVar5 = (this->StbState).undostate.undo_rec[lVar19 + -1].insert_length;
      sVar6 = (this->StbState).undostate.undo_rec[lVar19 + -1].delete_length;
      uVar23 = (uint)sVar6;
      sVar7 = (this->StbState).undostate.undo_rec[lVar19 + -1].char_storage;
      lVar19 = (long)(this->StbState).undostate.redo_point;
      (this->StbState).undostate.undo_rec[lVar19 + -1].char_storage = -1;
      (this->StbState).undostate.undo_rec[lVar19 + -1].insert_length = sVar6;
      (this->StbState).undostate.undo_rec[lVar19 + -1].delete_length = sVar5;
      (this->StbState).undostate.undo_rec[lVar19 + -1].where = iVar16;
      if (sVar6 == 0) goto LAB_00136e6d;
      if ((int)((int)(this->StbState).undostate.undo_char_point + uVar23) < 999) goto LAB_00136c28;
      (this->StbState).undostate.undo_rec[lVar19 + -1].insert_length = 0;
      goto LAB_00136e5a;
    case 0x1000b:
      lVar19 = (long)(this->StbState).undostate.redo_point;
      if (lVar19 == 99) goto LAB_00136ada;
      sVar5 = (this->StbState).undostate.undo_point;
      iVar16 = (this->StbState).undostate.undo_rec[lVar19].where;
      sVar6 = (this->StbState).undostate.undo_rec[lVar19].insert_length;
      sVar7 = (this->StbState).undostate.undo_rec[lVar19].delete_length;
      sVar8 = (this->StbState).undostate.undo_rec[lVar19].char_storage;
      (this->StbState).undostate.undo_rec[sVar5].delete_length = sVar6;
      (this->StbState).undostate.undo_rec[sVar5].insert_length = sVar7;
      (this->StbState).undostate.undo_rec[sVar5].where = iVar16;
      (this->StbState).undostate.undo_rec[sVar5].char_storage = -1;
      if (sVar7 == 0) goto LAB_00136da0;
      sVar9 = (this->StbState).undostate.undo_char_point;
      if ((int)(this->StbState).undostate.redo_char_point < (int)sVar9 + (int)sVar7) {
        pSVar11 = (this->StbState).undostate.undo_rec + sVar5;
        pSVar11->insert_length = 0;
        pSVar11->delete_length = 0;
        goto LAB_00136d95;
      }
      (this->StbState).undostate.undo_rec[sVar5].char_storage = sVar9;
      (this->StbState).undostate.undo_char_point = sVar9 + sVar7;
      if (sVar7 < 1) goto LAB_00136d95;
      iVar22 = (this->Text).Size;
      if (iVar22 < iVar16) {
        iVar22 = iVar16;
      }
      puVar10 = (this->Text).Data;
      uVar21 = 0;
      goto LAB_00136d69;
    case 0x1000c:
      iVar16 = (this->StbState).select_start;
      iVar22 = (this->StbState).select_end;
      if (iVar16 == iVar22) {
        iVar16 = state->cursor;
        if (0 < iVar16) goto LAB_00136779;
        iVar22 = iVar16 + -1;
        goto LAB_00136d26;
      }
      if (iVar22 < iVar16) {
        (this->StbState).select_end = iVar16;
        (this->StbState).select_start = iVar22;
      }
      iVar16 = (this->StbState).select_start;
      (this->StbState).cursor = iVar16;
      (this->StbState).select_end = iVar16;
      goto LAB_00136ada;
    case 0x1000d:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        iVar16 = ImGuiStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->StbState).cursor + 1);
        goto LAB_00136d2d;
      }
      ImGuiStb::stb_textedit_move_to_last(this,state);
      goto LAB_00136ade;
    default:
      switch(key) {
      case 0x30000:
        ImGuiStb::stb_textedit_clamp(this,state);
        iVar16 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar16) {
          iVar16 = (this->StbState).cursor;
          (this->StbState).select_end = iVar16;
          (this->StbState).select_start = iVar16;
        }
        else {
          state->cursor = iVar16;
        }
        iVar16 = (this->StbState).select_end;
        if (0 < iVar16) {
          (this->StbState).select_end = iVar16 + -1;
        }
        goto LAB_00136ac9;
      case 0x30001:
        iVar16 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar16) {
          iVar16 = (this->StbState).cursor;
          (this->StbState).select_end = iVar16;
          (this->StbState).select_start = iVar16;
        }
        else {
          state->cursor = iVar16;
        }
        piVar2 = &(this->StbState).select_end;
        *piVar2 = *piVar2 + 1;
        ImGuiStb::stb_textedit_clamp(this,state);
LAB_00136ac9:
        local_3c = (this->StbState).select_end;
        goto LAB_00136ad7;
      case 0x30002:
        goto switchD_0013629c_caseD_10002;
      case 0x30003:
        goto switchD_0013629c_caseD_10003;
      case 0x30004:
        ImGuiStb::stb_textedit_clamp(this,state);
        iVar22 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar22) {
          iVar22 = (this->StbState).cursor;
          (this->StbState).select_end = iVar22;
          (this->StbState).select_start = iVar22;
        }
        else {
          state->cursor = iVar22;
        }
        ImGuiStb::stb_textedit_find_charpos
                  ((ImGuiStb *)local_48,(StbFindState *)this,
                   (ImGuiTextEditState *)(ulong)(uint)(this->StbState).cursor,
                   (uint)(this->StbState).single_line,iVar16);
        break;
      case 0x30005:
        ImGuiStb::stb_textedit_clamp(this,state);
        iVar22 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar22) {
          iVar22 = (this->StbState).cursor;
          (this->StbState).select_end = iVar22;
          (this->StbState).select_start = iVar22;
        }
        else {
          state->cursor = iVar22;
        }
        ImGuiStb::stb_textedit_find_charpos
                  ((ImGuiStb *)local_48,(StbFindState *)this,
                   (ImGuiTextEditState *)(ulong)(uint)(this->StbState).cursor,
                   (uint)(this->StbState).single_line,iVar16);
        (this->StbState).has_preferred_x = '\0';
        lVar19 = (long)local_3c + (long)local_38;
        iVar16 = (int)lVar19;
        (this->StbState).cursor = iVar16;
        if (0 < (long)local_38) {
          if ((this->Text).Size < iVar16) goto LAB_00136eae;
          if ((this->Text).Data[lVar19 + -1] == 10) {
            state->cursor = iVar16 + -1;
          }
        }
        (this->StbState).select_end = (this->StbState).cursor;
        goto LAB_00136ade;
      case 0x30006:
        iVar16 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar16) {
          iVar16 = (this->StbState).cursor;
          (this->StbState).select_end = iVar16;
          (this->StbState).select_start = iVar16;
        }
        else {
          state->cursor = iVar16;
        }
        local_3c = 0;
        break;
      case 0x30007:
        iVar16 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar16) {
          iVar16 = (this->StbState).cursor;
          (this->StbState).select_end = iVar16;
          (this->StbState).select_start = iVar16;
        }
        else {
          state->cursor = iVar16;
        }
        local_3c = this->CurLenW;
        break;
      case 0x30008:
        goto switchD_0013629c_caseD_10008;
      case 0x30009:
        goto switchD_0013629c_caseD_10009;
      default:
        uVar23 = 0;
        if (key < 0x10000) {
          uVar23 = key;
        }
        if (((int)uVar23 < 1) ||
           ((local_48[0] = (ImWchar)uVar23, uVar23 == 10 && ((this->StbState).single_line != '\0')))
           ) goto LAB_00136ade;
        if (((this->StbState).insert_mode == '\0') ||
           (((this->StbState).select_start != (this->StbState).select_end ||
            (iVar22 = (this->StbState).cursor, this->CurLenW <= iVar22)))) {
          ImGuiStb::stb_textedit_delete_selection(this,state);
          bVar12 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,local_48,1);
          if (!bVar12) goto LAB_00136ade;
          ImGuiStb::stb_text_createundo(&(this->StbState).undostate,(this->StbState).cursor,0,1);
        }
        else {
          ImGuiStb::stb_text_makeundo_replace(this,state,iVar22,0x1651a0,iVar16);
          ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,(this->StbState).cursor,1);
          bVar12 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,local_48,1);
          if (!bVar12) goto LAB_00136ade;
        }
        (this->StbState).cursor = (this->StbState).cursor + 1;
        goto LAB_00136ada;
      case 0x3000c:
        if ((this->StbState).select_start == (this->StbState).select_end) {
          iVar16 = (this->StbState).cursor;
          (this->StbState).select_end = iVar16;
          (this->StbState).select_start = iVar16;
        }
        iVar16 = state->cursor;
        if (0 < iVar16) goto LAB_001366af;
        iVar22 = iVar16 + -1;
        goto LAB_00136bb4;
      case 0x3000d:
        if ((this->StbState).select_start == (this->StbState).select_end) {
          iVar16 = (this->StbState).cursor;
          (this->StbState).select_end = iVar16;
          (this->StbState).select_start = iVar16;
        }
        iVar16 = this->CurLenW;
        iVar15 = (this->StbState).cursor + 1;
        iVar22 = iVar15;
        if (iVar16 <= iVar15) goto LAB_00136725;
        goto LAB_0013670d;
      }
      (this->StbState).select_end = local_3c;
LAB_00136ad7:
      (this->StbState).cursor = local_3c;
      goto LAB_00136ada;
    }
  } while (local_74 != '\0');
  goto LAB_00136ade;
  while (iVar15 = iVar15 + 1, iVar22 = iVar16, iVar16 != iVar15) {
LAB_0013670d:
    iVar14 = ImGuiStb::is_word_boundary_from_right(this,iVar15);
    iVar22 = iVar15;
    if (iVar14 != 0) break;
  }
LAB_00136725:
  if (iVar22 < iVar16) {
    iVar16 = iVar22;
  }
  (this->StbState).cursor = iVar16;
  (this->StbState).select_end = iVar16;
  goto LAB_00136d30;
  while (iVar22 = iVar16 + -1, bVar12 = 0 < iVar16, iVar16 = iVar22, iVar22 != 0 && bVar12) {
LAB_001366af:
    iVar22 = iVar16 + -1;
    iVar15 = ImGuiStb::is_word_boundary_from_right(this,iVar22);
    if (iVar15 != 0) goto LAB_00136bb4;
  }
  iVar22 = -1;
LAB_00136bb4:
  iVar16 = 0;
  if (0 < iVar22) {
    iVar16 = iVar22;
  }
  (this->StbState).cursor = iVar16;
  (this->StbState).select_end = iVar16;
  goto LAB_00136d30;
  while( true ) {
    (this->StbState).undostate.undo_char
    [(long)(this->StbState).undostate.undo_rec[sVar5].char_storage + uVar21] =
         puVar10[(long)iVar16 + uVar21];
    uVar21 = uVar21 + 1;
    if ((long)(this->StbState).undostate.undo_rec[sVar5].insert_length <= (long)uVar21) break;
LAB_00136d69:
    if ((uint)(iVar22 - iVar16) == uVar21) goto LAB_00136eae;
  }
LAB_00136d95:
  ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar16,(int)sVar7);
LAB_00136da0:
  if (sVar6 != 0) {
    ImGuiStb::STB_TEXTEDIT_INSERTCHARS
              (this,iVar16,(this->StbState).undostate.undo_char + sVar8,(int)sVar6);
    psVar20 = &(this->StbState).undostate.redo_char_point;
    *psVar20 = *psVar20 + sVar6;
  }
  (this->StbState).cursor = iVar16 + sVar6;
  psVar20 = &(this->StbState).undostate.undo_point;
  *psVar20 = *psVar20 + 1;
  psVar20 = &(this->StbState).undostate.redo_point;
  *psVar20 = *psVar20 + 1;
  goto LAB_00136ada;
  while( true ) {
    if (sVar9 < 99) {
      if (-1 < (this->StbState).undostate.undo_rec[0x62].char_storage) {
        sVar9 = (this->StbState).undostate.undo_rec[0x62].insert_length;
        sVar13 = sVar8 + sVar9;
        (this->StbState).undostate.redo_char_point = sVar13;
        pIVar3 = (this->StbState).undostate.undo_char + sVar13;
        memmove(pIVar3,pIVar3 + -(long)sVar9,(long)sVar13 * -2 + 0x7ce);
        lVar19 = (long)(this->StbState).undostate.redo_point;
        if (lVar19 < 0x62) {
          lVar18 = lVar19 + -0x62;
          psVar20 = &(this->StbState).undostate.undo_rec[lVar19].char_storage;
          do {
            if (-1 < *psVar20) {
              *psVar20 = *psVar20 + sVar9;
            }
            psVar20 = psVar20 + 6;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 0);
        }
      }
      lVar19 = (long)(this->StbState).undostate.redo_point;
      memmove((this->StbState).undostate.undo_rec + lVar19,
              (this->StbState).undostate.undo_rec + lVar19 + -1,(99 - lVar19) * 0xc);
      psVar20 = &(this->StbState).undostate.redo_point;
      *psVar20 = *psVar20 + 1;
    }
    if ((this->StbState).undostate.redo_point == 99) break;
LAB_00136c28:
    iVar22 = (int)(this->StbState).undostate.undo_char_point + uVar23;
    sVar8 = (this->StbState).undostate.redo_char_point;
    sVar9 = (this->StbState).undostate.redo_point;
    if (iVar22 <= sVar8) {
      (this->StbState).undostate.undo_rec[(long)sVar9 + -1].char_storage = sVar8 - sVar6;
      (this->StbState).undostate.redo_char_point = sVar8 - sVar6;
      if (0 < sVar6) {
        iVar15 = (this->Text).Size;
        if (iVar15 < iVar16) {
          iVar15 = iVar16;
        }
        puVar10 = (this->Text).Data;
        uVar21 = 0;
        do {
          if ((uint)(iVar15 - iVar16) == uVar21) {
LAB_00136eae:
            __assert_fail("i < Size",
                          "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                          ,0x35c,
                          "const value_type &ImVector<unsigned short>::operator[](int) const [T = unsigned short]"
                         );
          }
          (this->StbState).undostate.undo_char
          [(long)(this->StbState).undostate.undo_rec[(long)sVar9 + -1].char_storage + uVar21] =
               puVar10[(long)iVar16 + uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar23 != uVar21);
      }
      break;
    }
  }
  if (iVar22 <= sVar8) {
LAB_00136e5a:
    ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar16,uVar23);
LAB_00136e6d:
    if (sVar5 != 0) {
      ImGuiStb::STB_TEXTEDIT_INSERTCHARS
                (this,iVar16,(this->StbState).undostate.undo_char + sVar7,(int)sVar5);
      psVar20 = &(this->StbState).undostate.undo_char_point;
      *psVar20 = *psVar20 - sVar5;
    }
    (this->StbState).cursor = iVar16 + sVar5;
    psVar20 = &(this->StbState).undostate.undo_point;
    *psVar20 = *psVar20 + -1;
    psVar20 = &(this->StbState).undostate.redo_point;
    *psVar20 = *psVar20 + -1;
  }
LAB_00136ada:
  (this->StbState).has_preferred_x = '\0';
  goto LAB_00136ade;
  while (iVar22 = iVar16 + -1, bVar12 = 0 < iVar16, iVar16 = iVar22, iVar22 != 0 && bVar12) {
LAB_00136779:
    iVar22 = iVar16 + -1;
    iVar15 = ImGuiStb::is_word_boundary_from_right(this,iVar22);
    if (iVar15 != 0) goto LAB_00136d26;
  }
  iVar22 = -1;
LAB_00136d26:
  iVar16 = 0;
  if (0 < iVar22) {
    iVar16 = iVar22;
  }
LAB_00136d2d:
  (this->StbState).cursor = iVar16;
LAB_00136d30:
  ImGuiStb::stb_textedit_clamp(this,state);
LAB_00136ade:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiTextEditState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &StbState, key);
    CursorFollow = true;
    CursorAnimReset();
}